

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::SimplifyLocals<true,_false,_true>::create(SimplifyLocals<true,_false,_true> *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x398);
  memset(__s,0,0x340);
  __s[2] = (_func_int *)(__s + 4);
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  *(undefined8 *)((long)__s + 0x121) = 0;
  *(undefined8 *)((long)__s + 0x129) = 0;
  *__s = (_func_int *)&PTR__SimplifyLocals_01076228;
  __s[0x2a] = (_func_int *)(__s + 0x28);
  __s[0x2b] = (_func_int *)(__s + 0x28);
  __s[0x30] = (_func_int *)(__s + 0x2e);
  __s[0x31] = (_func_int *)(__s + 0x2e);
  __s[0x36] = (_func_int *)(__s + 0x34);
  __s[0x37] = (_func_int *)(__s + 0x34);
  __s[0x3d] = (_func_int *)0x0;
  __s[0x3e] = (_func_int *)0x0;
  __s[0x38] = (_func_int *)0x0;
  __s[0x39] = (_func_int *)0x0;
  __s[0x3a] = (_func_int *)0x0;
  __s[0x3b] = (_func_int *)0x0;
  __s[0x53] = (_func_int *)0x0;
  __s[0x54] = (_func_int *)0x0;
  __s[0x55] = (_func_int *)0x0;
  __s[0x56] = (_func_int *)0x0;
  __s[0x57] = (_func_int *)0x0;
  __s[0x58] = (_func_int *)0x0;
  __s[0x59] = (_func_int *)0x0;
  __s[0x5a] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x5b) = 0;
  __s[0x71] = (_func_int *)0x0;
  __s[0x72] = (_func_int *)0x0;
  __s[0x6f] = (_func_int *)0x0;
  __s[0x70] = (_func_int *)0x0;
  __s[0x6d] = (_func_int *)0x0;
  __s[0x6e] = (_func_int *)0x0;
  __s[0x6b] = (_func_int *)0x0;
  __s[0x6c] = (_func_int *)0x0;
  __s[0x69] = (_func_int *)0x0;
  __s[0x6a] = (_func_int *)0x0;
  __s[0x67] = (_func_int *)0x0;
  __s[0x68] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<
      SimplifyLocals<allowTee, allowStructure, allowNesting>>();
  }